

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_uncheckedSlotAt(sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex)

{
  _Bool _Var1;
  size_t sVar2;
  size_t slotIndex_local;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(tuple);
  if (!_Var1) {
    sysbvm_error_modifyImmediateValue();
  }
  _Var1 = sysbvm_tuple_isBytes(tuple);
  if (_Var1) {
    sysbvm_error("uncheckedSlotAt used with byte tuple.");
  }
  sVar2 = sysbvm_tuple_getSizeInSlots(tuple);
  if (sVar2 <= slotIndex) {
    sysbvm_error_outOfBoundsSlotAccess();
  }
  return *(sysbvm_tuple_t *)(tuple + 0x10 + slotIndex * 8);
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_uncheckedSlotAt(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex)
{
    (void)context;
    if(!sysbvm_tuple_isNonNullPointer(tuple)) sysbvm_error_modifyImmediateValue();
    if(sysbvm_tuple_isBytes(tuple)) sysbvm_error("uncheckedSlotAt used with byte tuple.");
    if(slotIndex >= sysbvm_tuple_getSizeInSlots(tuple)) sysbvm_error_outOfBoundsSlotAccess();
    
    return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->pointers[slotIndex];
}